

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

Rational128 * __thiscall btConvexHullInternal::Vertex::dot(Vertex *this,Point64 *b)

{
  Point64 *in_RDX;
  long in_RSI;
  Rational128 *in_RDI;
  Int128 IVar1;
  Rational128 *this_00;
  int64_t in_stack_ffffffffffffffb0;
  Rational128 *this_01;
  undefined1 in_stack_ffffffffffffffc0 [16];
  int64_t value;
  Rational128 *in_stack_ffffffffffffffd0;
  
  value = in_stack_ffffffffffffffc0._8_8_;
  if (*(int *)(in_RSI + 0x74) < 0) {
    this_00 = in_RDI;
    IVar1 = Int128::operator*(in_stack_ffffffffffffffc0._0_8_,in_stack_ffffffffffffffb0);
    this_01 = (Rational128 *)IVar1.low;
    IVar1 = Int128::operator*((Int128 *)this_01,in_stack_ffffffffffffffb0);
    Int128::operator+(&this_00->numerator,&in_RDI->numerator);
    Int128::operator*(&this_01->numerator,IVar1.high);
    Int128::operator+(&this_00->numerator,&in_RDI->numerator);
    Rational128::Rational128(this_01,(Int128 *)IVar1.high,(Int128 *)IVar1.low);
  }
  else {
    Point32::dot((Point32 *)(in_RSI + 0x68),in_RDX);
    Rational128::Rational128(in_stack_ffffffffffffffd0,value);
    this_00 = in_RDI;
  }
  return this_00;
}

Assistant:

Rational128 dot(const Point64& b) const
				{
					return (point.index >= 0) ? Rational128(point.dot(b))
						: Rational128(point128.x * b.x + point128.y * b.y + point128.z * b.z, point128.denominator);
				}